

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O3

void Fxu_HeapDoubleMoveDn(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fxu_Double *pFVar4;
  Fxu_Double **ppFVar5;
  uint uVar6;
  int iVar7;
  Fxu_Double **ppFVar8;
  Fxu_Double **ppFVar9;
  Fxu_Double *pFVar10;
  
  iVar1 = p->nItems;
  pFVar4 = p->pTree[(int)pDiv];
  uVar6 = pFVar4->HNum * 2;
  if ((int)uVar6 <= iVar1) {
    ppFVar8 = p->pTree + (int)pDiv;
    iVar7 = pFVar4->HNum;
    do {
      ppFVar5 = p->pTree;
      ppFVar9 = ppFVar5 + (int)uVar6;
      if ((int)uVar6 < iVar1) {
        iVar2 = (*ppFVar9)->Weight;
        iVar3 = ppFVar5[(int)(uVar6 | 1)]->Weight;
        if ((iVar2 <= pFVar4->Weight) && (iVar3 <= pFVar4->Weight)) {
          return;
        }
        pFVar10 = *ppFVar9;
        if (iVar2 < iVar3) {
          ppFVar9 = ppFVar5 + (int)(uVar6 | 1);
          pFVar10 = ppFVar5[(int)(uVar6 | 1)];
        }
      }
      else {
        pFVar10 = *ppFVar9;
        if ((*ppFVar9)->Weight <= pFVar4->Weight) {
          return;
        }
      }
      *ppFVar8 = pFVar10;
      *ppFVar9 = pFVar4;
      iVar2 = (*ppFVar8)->HNum;
      (*ppFVar8)->HNum = iVar7;
      pFVar4->HNum = iVar2;
      uVar6 = iVar2 * 2;
      ppFVar8 = ppFVar9;
      iVar7 = iVar2;
    } while ((int)uVar6 <= iVar1);
  }
  return;
}

Assistant:

void Fxu_HeapDoubleMoveDn( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
    Fxu_Double ** ppChild1, ** ppChild2, ** ppDiv;
    ppDiv = &FXU_HEAP_DOUBLE_CURRENT(p, pDiv);
    while ( FXU_HEAP_DOUBLE_CHILD1_EXISTS(p,*ppDiv) )
    { // if Child1 does not exist, Child2 also does not exists

        // get the children
        ppChild1 = &FXU_HEAP_DOUBLE_CHILD1(p,*ppDiv);
        if ( FXU_HEAP_DOUBLE_CHILD2_EXISTS(p,*ppDiv) )
        {
            ppChild2 = &FXU_HEAP_DOUBLE_CHILD2(p,*ppDiv);

            // consider two cases
            if ( FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild1) &&
                 FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild2) )
            { // Div is larger than both, skip
                break;
            }
            else
            { // Div is smaller than one of them, then swap it with larger 
                if ( FXU_HEAP_DOUBLE_WEIGHT(*ppChild1) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild2) )
                {
                    Fxu_HeapDoubleSwap( ppDiv, ppChild1 );
                    // update the pointer
                    ppDiv = ppChild1;
                }
                else
                {
                    Fxu_HeapDoubleSwap( ppDiv, ppChild2 );
                    // update the pointer
                    ppDiv = ppChild2;
                }
            }
        }
        else // Child2 does not exist
        {
            // consider two cases
            if ( FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild1) )
            { // Div is larger than Child1, skip
                break;
            }
            else
            { // Div is smaller than Child1, then swap them
                Fxu_HeapDoubleSwap( ppDiv, ppChild1 );
                // update the pointer
                ppDiv = ppChild1;
            }
        }
    }
}